

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluProgramInterfaceQuery.hpp
# Opt level: O0

InterfaceVariableInfo *
glu::getProgramInterfaceVariableInfo
          (InterfaceVariableInfo *__return_storage_ptr__,Functions *gl,deUint32 program,
          deUint32 programInterface,deUint32 index)

{
  deUint32 index_local;
  deUint32 programInterface_local;
  deUint32 program_local;
  Functions *gl_local;
  InterfaceVariableInfo *info;
  
  InterfaceVariableInfo::InterfaceVariableInfo(__return_storage_ptr__);
  getProgramInterfaceVariableInfo(gl,program,programInterface,index,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline InterfaceVariableInfo getProgramInterfaceVariableInfo (const glw::Functions& gl, deUint32 program, deUint32 programInterface, deUint32 index)
{
	InterfaceVariableInfo info;
	getProgramInterfaceVariableInfo(gl, program, programInterface, index, info);
	return info;
}